

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O2

void __thiscall
unodb::
olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::iterator::pop(iterator *this)

{
  stack_entry *psVar1;
  
  if ((this->stack_).c.
      super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (this->stack_).c.
      super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    psVar1 = top(this);
    detail::key_buffer::pop
              (&this->keybuf_,(ulong)(psVar1->super_iter_result).prefix.f.key_prefix_length);
    std::
    deque<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
    ::pop_back(&(this->stack_).c);
    return;
  }
  __assert_fail("!empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                ,0x1dd,
                "void unodb::olc_db<std::span<const std::byte>, std::span<const std::byte>>::iterator::pop() [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
               );
}

Assistant:

void pop() noexcept {
      UNODB_DETAIL_ASSERT(!empty());

      // Note: We DO NOT need to check the RCS here. The prefix_len
      // on the stack is known to be valid at the time that the entry
      // was pushed onto the stack and the stack and the keybuf are in
      // sync with one another.  So we can just do a simple POP for
      // each of them.
      const auto prefix_len = top().prefix.length();
      keybuf_.pop(prefix_len);
      stack_.pop();
    }